

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

Belief * __thiscall despot::ParticleBelief::MakeCopy(ParticleBelief *this)

{
  pointer ppSVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  ParticleBelief *this_00;
  int i;
  ulong uVar4;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  State *local_60;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0;
  while( true ) {
    ppSVar1 = (this->particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->particles_).
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar4) break;
    pDVar2 = (this->super_Belief).model_;
    iVar3 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar1[uVar4]);
    local_60 = (State *)CONCAT44(extraout_var,iVar3);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)&local_58,&local_60);
    uVar4 = uVar4 + 1;
  }
  this_00 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_38,
             (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_58);
  ParticleBelief(this_00,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_38,
                 (this->super_Belief).model_,this->prior_,this->split_);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_38);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_58);
  return &this_00->super_Belief;
}

Assistant:

Belief* ParticleBelief::MakeCopy() const {
	vector<State*> copy;
	for (int i = 0; i < particles_.size(); i++) {
		copy.push_back(model_->Copy(particles_[i]));
	}

	return new ParticleBelief(copy, model_, prior_, split_);
}